

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_common.hpp
# Opt level: O0

key_encoder * __thiscall unodb::key_encoder::encode(key_encoder *this,uint16_t v)

{
  undefined2 uVar1;
  unsigned_short u;
  uint16_t v_local;
  key_encoder *this_local;
  
  ensure_available(this,2);
  uVar1 = detail::bswap<unsigned_short>(v);
  *(undefined2 *)(this->buf + this->off) = uVar1;
  this->off = this->off + 2;
  return this;
}

Assistant:

key_encoder &encode(std::uint16_t v) {
    ensure_available(sizeof(v));
#ifdef UNODB_DETAIL_LITTLE_ENDIAN
    const auto u = unodb::detail::bswap(v);
#else
    const auto u = v;
#endif
    UNODB_DETAIL_ASSERT(sizeof(u) == sizeof(v));
    std::memcpy(buf + off, &u, sizeof(v));
    off += sizeof(v);
    return *this;
  }